

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double angle_cdf(double x,int n)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (n < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"ANGLE_CDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N must be at least 2.\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  The input value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    exit(1);
  }
  dVar2 = 0.0;
  if (0.0 <= x) {
    if (x <= 3.141592653589793) {
      if (n == 2) {
        dVar2 = x / 3.141592653589793;
      }
      else {
        dVar2 = sin_power_int(0.0,x,n + -2);
        dVar3 = tgamma((double)n * 0.5);
        dVar4 = tgamma((double)(n + -1) * 0.5);
        dVar2 = (dVar3 * dVar2) / (dVar4 * 1.7724538509055159);
      }
    }
    else {
      dVar2 = 1.0;
    }
  }
  return dVar2;
}

Assistant:

double angle_cdf ( double x, int n )

//****************************************************************************80
//
//  Purpose:
//
//    ANGLE_CDF evaluates the Angle CDF.
//
//  Modified:
//
//    19 November 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Reuven Rubinstein,
//    Monte Carlo Optimization, Simulation and Sensitivity of Queueing Networks,
//    Wiley, 1986.
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, int N, the spatial dimension.
//    N must be at least 2.
//
//    Output, real CDF, the value of the CDF.
//
{
  double cdf;
  const double r8_pi = 3.14159265358979323;
  double zero = 0.0;

  if ( n < 2 )
  {
    cerr << "\n";
    cerr << "ANGLE_CDF - Fatal error!\n";
    cerr << "  N must be at least 2.\n";
    cerr << "  The input value of N = " << n << "\n";
    exit ( 1 );
  }

  if ( x < 0.0 )
  {
    cdf = 0.0;
  }
  else if ( r8_pi < x )
  {
    cdf = 1.0;
  }
  else if ( n == 2 )
  {
    cdf = x / r8_pi;
  }
  else
  {
    cdf = sin_power_int ( zero, x, n - 2 )
      * tgamma ( static_cast<double>(n ) / 2.0 )
      / ( sqrt ( r8_pi ) * tgamma ( static_cast<double>(n - 1 ) / 2.0 ) );
  }

  return cdf;
}